

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O0

void uv_close(uv_handle_t *handle,uv_close_cb close_cb)

{
  undefined8 in_RSI;
  undefined8 *in_RDI;
  
  if ((*(uint *)(in_RDI + 6) & 3) == 0) {
    *(uint *)(in_RDI + 6) = *(uint *)(in_RDI + 6) | 1;
    *in_RDI = in_RSI;
    switch(*(undefined4 *)(in_RDI + 3)) {
    case 1:
      uv__async_close((uv_async_t *)0x10bd14);
      break;
    case 2:
      uv__check_close((uv_check_t *)0x10bcfc);
      break;
    case 3:
      uv__fs_event_close((uv_fs_event_t *)0x10bd38);
      break;
    case 4:
      uv__fs_poll_close((uv_fs_poll_t *)0x10bd50);
      break;
    default:
      __assert_fail("0","src/unix/core.c",0x92,"void uv_close(uv_handle_t *, uv_close_cb)");
    case 6:
      uv__idle_close((uv_idle_t *)0x10bd08);
      break;
    case 7:
      uv__pipe_close((uv_pipe_t *)0x10bcb1);
      break;
    case 8:
      uv__poll_close((uv_poll_t *)0x10bd44);
      break;
    case 9:
      uv__prepare_close((uv_prepare_t *)0x10bced);
      break;
    case 10:
      uv__process_close((uv_process_t *)0x10bd2c);
      break;
    case 0xc:
      uv__tcp_close((uv_tcp_t *)0x10bccf);
      break;
    case 0xd:
      uv__timer_close((uv_timer_t *)0x10bd20);
      break;
    case 0xe:
      uv__stream_close((uv_stream_t *)0x10bcc0);
      break;
    case 0xf:
      uv__udp_close((uv_udp_t *)0x10bcde);
      break;
    case 0x10:
      uv__signal_close((uv_signal_t *)0x10bd5c);
      return;
    }
    uv__make_close_pending((uv_handle_t *)0x10bd87);
    return;
  }
  __assert_fail("!(handle->flags & (UV_CLOSING | UV_CLOSED))","src/unix/core.c",0x51,
                "void uv_close(uv_handle_t *, uv_close_cb)");
}

Assistant:

void uv_close(uv_handle_t* handle, uv_close_cb close_cb) {
  assert(!(handle->flags & (UV_CLOSING | UV_CLOSED)));

  handle->flags |= UV_CLOSING;
  handle->close_cb = close_cb;

  switch (handle->type) {
  case UV_NAMED_PIPE:
    uv__pipe_close((uv_pipe_t*)handle);
    break;

  case UV_TTY:
    uv__stream_close((uv_stream_t*)handle);
    break;

  case UV_TCP:
    uv__tcp_close((uv_tcp_t*)handle);
    break;

  case UV_UDP:
    uv__udp_close((uv_udp_t*)handle);
    break;

  case UV_PREPARE:
    uv__prepare_close((uv_prepare_t*)handle);
    break;

  case UV_CHECK:
    uv__check_close((uv_check_t*)handle);
    break;

  case UV_IDLE:
    uv__idle_close((uv_idle_t*)handle);
    break;

  case UV_ASYNC:
    uv__async_close((uv_async_t*)handle);
    break;

  case UV_TIMER:
    uv__timer_close((uv_timer_t*)handle);
    break;

  case UV_PROCESS:
    uv__process_close((uv_process_t*)handle);
    break;

  case UV_FS_EVENT:
    uv__fs_event_close((uv_fs_event_t*)handle);
    break;

  case UV_POLL:
    uv__poll_close((uv_poll_t*)handle);
    break;

  case UV_FS_POLL:
    uv__fs_poll_close((uv_fs_poll_t*)handle);
    break;

  case UV_SIGNAL:
    uv__signal_close((uv_signal_t*) handle);
    /* Signal handles may not be closed immediately. The signal code will */
    /* itself close uv__make_close_pending whenever appropriate. */
    return;

  default:
    assert(0);
  }

  uv__make_close_pending(handle);
}